

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
__thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
static_resources::
create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::object_projection>
          (static_resources *this,object_projection *val)

{
  pointer ppeVar1;
  _Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  _Var2;
  pointer __p;
  pointer *__ptr;
  __uniq_ptr_impl<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_28;
  object_projection *local_20;
  
  _Var2._M_head_impl =
       (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
       operator_new(0x30);
  _Var2._M_head_impl[1] =
       (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>)
       (val->super_projection_base).super_expression_type.precedence_level_;
  *(undefined2 *)(_Var2._M_head_impl + 2) =
       *(undefined2 *)&(val->super_projection_base).super_expression_type.is_right_associative_;
  ppeVar1 = (val->super_projection_base).expressions_.
            super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  (((expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
   (_Var2._M_head_impl + 3))->
  super_expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>).
  _vptr_expr_base =
       (_func_int **)
       (val->super_projection_base).expressions_.
       super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_head_impl[4] =
       (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>)
       ppeVar1;
  _Var2._M_head_impl[5] =
       (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>)
       (val->super_projection_base).expressions_.
       super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (val->super_projection_base).expressions_.
  super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
  &(_Var2._M_head_impl)->_vptr_expr_base)->_vptr_expr_base =
       (_func_int **)&PTR__projection_base_00b35910;
  local_20 = (object_projection *)0x0;
  local_28._M_t.
  super__Tuple_impl<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        )(tuple<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          )_Var2._M_head_impl;
  std::
  vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
  ::
  emplace_back<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
            ((vector<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
              *)(this + 0x38),
             (unique_ptr<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl !=
      (expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)0x0)
  {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          .
                          super__Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
                          ._M_head_impl + 8))();
    if (local_20 != (object_projection *)0x0) {
      std::
      default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::object_projection>
      ::operator()((default_delete<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::object_projection>
                    *)&local_20,local_20);
    }
  }
  return (expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *)(_Head_base<0UL,_jsoncons::jmespath::expr_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
             )_Var2._M_head_impl;
}

Assistant:

expr_base_impl<Json>* create_expression(T&& val)
            {
                auto temp = jsoncons::make_unique<T>(std::forward<T>(val));
                expr_base_impl<Json>* ptr = temp.get();
                expr_storage_.push_back(std::move(temp));
                return ptr;
            }